

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigFanout.c
# Opt level: O1

void Aig_ManFanoutStart(Aig_Man_t *p)

{
  int iVar1;
  Aig_Obj_t *pFanout;
  int *__s;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  long lVar4;
  
  if (p->nObjs[4] != 0) {
    __assert_fail("Aig_ManBufNum(p) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigFanout.c"
                  ,0x3c,"void Aig_ManFanoutStart(Aig_Man_t *)");
  }
  if (p->pFanData == (int *)0x0) {
    iVar1 = p->vObjs->nSize;
    iVar3 = 0x1000;
    if (0x7ff < iVar1) {
      iVar3 = iVar1 * 2;
    }
    p->nFansAlloc = iVar3;
    __s = (int *)malloc((long)(iVar3 * 5) << 2);
    p->pFanData = __s;
    memset(__s,0,(long)iVar3 * 0x14);
    pVVar2 = p->vObjs;
    if (0 < pVVar2->nSize) {
      lVar4 = 0;
      do {
        pFanout = (Aig_Obj_t *)pVVar2->pArray[lVar4];
        if (pFanout != (Aig_Obj_t *)0x0) {
          if (pFanout->pFanin0 != (Aig_Obj_t *)0x0) {
            Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pFanout->pFanin0 & 0xfffffffffffffffe),pFanout);
          }
          if (pFanout->pFanin1 != (Aig_Obj_t *)0x0) {
            Aig_ObjAddFanout(p,(Aig_Obj_t *)((ulong)pFanout->pFanin1 & 0xfffffffffffffffe),pFanout);
          }
        }
        lVar4 = lVar4 + 1;
        pVVar2 = p->vObjs;
      } while (lVar4 < pVVar2->nSize);
    }
    return;
  }
  __assert_fail("p->pFanData == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigFanout.c"
                ,0x3e,"void Aig_ManFanoutStart(Aig_Man_t *)");
}

Assistant:

void Aig_ManFanoutStart( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i;
    assert( Aig_ManBufNum(p) == 0 );
    // allocate fanout datastructure
    assert( p->pFanData == NULL );
    p->nFansAlloc = 2 * Aig_ManObjNumMax(p);
    if ( p->nFansAlloc < (1<<12) )
        p->nFansAlloc = (1<<12);
    p->pFanData = ABC_ALLOC( int, 5 * p->nFansAlloc );
    memset( p->pFanData, 0, sizeof(int) * 5 * p->nFansAlloc );
    // add fanouts for all objects
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( Aig_ObjChild0(pObj) )
            Aig_ObjAddFanout( p, Aig_ObjFanin0(pObj), pObj );
        if ( Aig_ObjChild1(pObj) )
            Aig_ObjAddFanout( p, Aig_ObjFanin1(pObj), pObj );
    }
}